

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::Helper::GetRunStateDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  cmInstallCommandArguments *local_20;
  cmInstallCommandArguments *args_local;
  Helper *this_local;
  
  local_20 = args;
  args_local = (cmInstallCommandArguments *)this;
  this_local = (Helper *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INSTALL_RUNSTATEDIR",&local_41);
  GetLocalStateDestination_abi_cxx11_(&local_98,this,(cmInstallCommandArguments *)0x0);
  std::operator+(&local_78,&local_98,"/run");
  anon_unknown.dwarf_a590ed::Helper::GetDestination
            (__return_storage_ptr__,(Helper *)this,args,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetRunStateDestination(
  const cmInstallCommandArguments* args) const
{
  return this->GetDestination(args, "CMAKE_INSTALL_RUNSTATEDIR",
                              this->GetLocalStateDestination(nullptr) +
                                "/run");
}